

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O2

void Am_Text_Command_Undo_proc(Am_Object *command_obj)

{
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_20,command_obj);
  Am_Object::Am_Object(&AStack_28,&Am_No_Object);
  Am_Value::Am_Value(&local_18,&Am_No_Value);
  text_general_undo_redo(&local_20,true,false,false,&AStack_28,&local_18);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Text_Command_Undo,
                 (Am_Object command_obj))
{
  text_general_undo_redo(command_obj, true, false, false);
}